

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O3

void __thiscall duckdb::AlterInfo::Serialize(AlterInfo *this,Serializer *serializer)

{
  (*serializer->_vptr_Serializer[2])(serializer,100,"info_type");
  Serializer::WriteValue<duckdb::ParseInfoType>(serializer,(this->super_ParseInfo).info_type);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,200,"type");
  Serializer::WriteValue<duckdb::AlterType>(serializer,(this->super_ParseInfo).field_0x9);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xc9,"catalog",&this->catalog);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>(serializer,0xca,"schema",&this->schema)
  ;
  Serializer::WritePropertyWithDefault<std::__cxx11::string>(serializer,0xcb,"name",&this->name);
  (*serializer->_vptr_Serializer[2])(serializer,0xcc,"if_not_found");
  Serializer::WriteValue<duckdb::OnEntryNotFound>(serializer,(this->super_ParseInfo).field_0xa);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<bool>(serializer,0xcd,"allow_internal",&this->allow_internal)
  ;
  return;
}

Assistant:

void AlterInfo::Serialize(Serializer &serializer) const {
	ParseInfo::Serialize(serializer);
	serializer.WriteProperty<AlterType>(200, "type", type);
	serializer.WritePropertyWithDefault<string>(201, "catalog", catalog);
	serializer.WritePropertyWithDefault<string>(202, "schema", schema);
	serializer.WritePropertyWithDefault<string>(203, "name", name);
	serializer.WriteProperty<OnEntryNotFound>(204, "if_not_found", if_not_found);
	serializer.WritePropertyWithDefault<bool>(205, "allow_internal", allow_internal);
}